

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O2

int nni_tcp_dialer_alloc(nng_stream_dialer **dp,nng_url *url)

{
  char *__s;
  int iVar1;
  nng_stream_dialer *arg;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  
  arg = (nng_stream_dialer *)nni_zalloc(0x5d0);
  if (arg == (nng_stream_dialer *)0x0) {
    iVar1 = 2;
  }
  else {
    nni_mtx_init((nni_mtx *)&arg[0x16].sd_close);
    nni_aio_list_init((nni_list *)&arg[0x15].sd_get_tls);
    nni_aio_init((nni_aio *)&arg[7].sd_get,tcp_dial_res_cb,arg);
    nni_aio_init((nni_aio *)&arg[0xe].sd_set,tcp_dial_con_cb,arg);
    iVar1 = nni_tcp_dialer_init((nni_tcp_dialer **)&arg[7].sd_dial);
    if (iVar1 == 0) {
      arg->sd_close = tcp_dialer_close;
      arg->sd_free = tcp_dialer_free;
      arg->sd_stop = tcp_dialer_stop;
      arg->sd_dial = tcp_dialer_dial;
      arg->sd_get = tcp_dialer_get;
      arg->sd_set = tcp_dialer_set;
      if (url->u_port != 0) {
        __s = url->u_hostname;
        sVar2 = strlen(__s);
        if (0xffffffffffffff00 < sVar2 - 0x100) {
          pcVar4 = url->u_scheme;
          pcVar3 = strchr(pcVar4,0x34);
          if (pcVar3 == (char *)0x0) {
            pcVar4 = strchr(pcVar4,0x36);
            if (pcVar4 == (char *)0x0) {
              *(undefined4 *)((long)&arg[5].sd_free + 4) = 0;
            }
            else {
              *(undefined4 *)((long)&arg[5].sd_free + 4) = 4;
            }
          }
          else {
            *(undefined4 *)((long)&arg[5].sd_free + 4) = 3;
          }
          snprintf((char *)(arg + 1),0x100,"%s",__s);
          *(short *)&arg[5].sd_free = (short)url->u_port;
          *dp = arg;
          return 0;
        }
      }
      tcp_dialer_free(arg);
      iVar1 = 0xf;
    }
    else {
      tcp_dialer_free(arg);
    }
  }
  return iVar1;
}

Assistant:

static int
tcp_dialer_alloc(tcp_dialer **dp)
{
	int         rv;
	tcp_dialer *d;

	if ((d = NNI_ALLOC_STRUCT(d)) == NULL) {
		return (NNG_ENOMEM);
	}

	nni_mtx_init(&d->mtx);
	nni_aio_list_init(&d->conaios);
	nni_aio_init(&d->resaio, tcp_dial_res_cb, d);
	nni_aio_init(&d->conaio, tcp_dial_con_cb, d);

	if ((rv = nni_tcp_dialer_init(&d->d)) != 0) {
		tcp_dialer_free(d);
		return (rv);
	}

	d->ops.sd_close = tcp_dialer_close;
	d->ops.sd_free  = tcp_dialer_free;
	d->ops.sd_stop  = tcp_dialer_stop;
	d->ops.sd_dial  = tcp_dialer_dial;
	d->ops.sd_get   = tcp_dialer_get;
	d->ops.sd_set   = tcp_dialer_set;

	*dp = d;
	return (0);
}